

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# inlined_vector.h
# Opt level: O1

reference __thiscall
absl::InlinedVector<int,4ul,std::allocator<int>>::GrowAndEmplaceBack<int_const&>
          (InlinedVector<int,4ul,std::allocator<int>> *this,int *args)

{
  ulong uVar1;
  int *piVar2;
  InlinedVector<int,4ul,std::allocator<int>> *pIVar3;
  ulong uVar4;
  long lVar5;
  ulong uVar6;
  Allocation new_allocation;
  
  uVar1 = *(ulong *)this;
  uVar4 = uVar1 >> 1;
  uVar6 = 4;
  if ((uVar1 & 1) != 0) {
    uVar6 = *(ulong *)(this + 8);
  }
  if (uVar4 == uVar6) {
    piVar2 = __gnu_cxx::new_allocator<int>::allocate
                       ((new_allocator<int> *)this,uVar6 * 2,(void *)0x0);
    piVar2[uVar4] = *args;
    if (((byte)*this & 1) == 0) {
      pIVar3 = this + 8;
    }
    else {
      pIVar3 = *(InlinedVector<int,4ul,std::allocator<int>> **)(this + 0x10);
    }
    if (1 < uVar1) {
      lVar5 = 0;
      do {
        *(undefined4 *)((long)piVar2 + lVar5) = *(undefined4 *)(pIVar3 + lVar5);
        lVar5 = lVar5 + 4;
      } while (uVar4 * 4 - lVar5 != 0);
    }
    new_allocation.buffer_ = piVar2;
    new_allocation.capacity_ = uVar6 * 2;
    InlinedVector<int,_4UL,_std::allocator<int>_>::ResetAllocation
              ((InlinedVector<int,_4UL,_std::allocator<int>_> *)this,new_allocation,uVar4 + 1);
    return piVar2 + uVar4;
  }
  __assert_fail("size() == capacity()",
                "/workspace/llm4binary/github/license_all_cmakelists_25/figroc[P]s2geometry/src/s2/third_party/absl/container/inlined_vector.h"
                ,0x327,
                "reference absl::InlinedVector<int, 4>::GrowAndEmplaceBack(Args &&...) [T = int, N = 4, A = std::allocator<int>, Args = <const int &>]"
               );
}

Assistant:

reference GrowAndEmplaceBack(Args&&... args) {
    assert(size() == capacity());
    const size_type s = size();

    Allocation new_allocation(allocator(), 2 * capacity());

    reference new_element =
        Construct(new_allocation.buffer() + s, std::forward<Args>(args)...);
    UninitializedCopy(std::make_move_iterator(data()),
                      std::make_move_iterator(data() + s),
                      new_allocation.buffer());

    ResetAllocation(new_allocation, s + 1);

    return new_element;
  }